

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

Integer nga_sprs_array_create_(Integer *idim,Integer *jdim,Integer *type)

{
  Integer IVar1;
  Integer in_RDI;
  Integer unaff_retaddr;
  Integer in_stack_00000008;
  int ctype;
  
  IVar1 = pnga_sprs_array_create((Integer)type,in_stack_00000008,unaff_retaddr,in_RDI);
  return IVar1;
}

Assistant:

Integer nga_sprs_array_create_(Integer *idim, Integer *jdim, Integer *type)
{
  int ctype;
  if (*type == MT_F_INT) {
    if (sizeof(Integer) == 4) {
      ctype = C_INT;
    } else {
      ctype = C_LONG;
    }
  } else if (*type == MT_F_REAL) {
    ctype = C_FLOAT;
  } else if (*type == MT_F_DBL) {
    ctype = C_DBL;
  } else if (*type == MT_F_SCPL) {
    ctype = C_SCPL;
  } else if (*type == MT_F_DCPL) {
    ctype = C_DCPL;
  }
  return wnga_sprs_array_create(*idim,*jdim,ctype,sizeof(Integer));
}